

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mult.hpp
# Opt level: O0

void calc_mean_and_sd_weighted<double,int,std::vector<double,std::allocator<double>>,double>
               (size_t *ix_arr,size_t st,size_t end,size_t col_num,double *Xc,int *Xc_ind,
               int *Xc_indptr,double *x_sd,double *x_mean,vector<double,_std::allocator<double>_> *w
               )

{
  double __x;
  int iVar1;
  uint uVar2;
  int iVar3;
  long lVar4;
  reference pvVar5;
  int *piVar6;
  long in_RCX;
  ulong in_RDX;
  ulong in_RSI;
  long in_RDI;
  long in_R8;
  long in_R9;
  bool bVar7;
  double dVar8;
  size_t *row_1;
  double w_this;
  double m_prev;
  double s;
  double m;
  double added;
  size_t row;
  double cnt;
  size_t *ptr_st;
  size_t ind_end_col;
  size_t curr_pos;
  size_t end_col;
  size_t st_col;
  byte local_a2;
  ulong *local_a0;
  unsigned_long *in_stack_ffffffffffffff70;
  unsigned_long *__val;
  unsigned_long *in_stack_ffffffffffffff78;
  unsigned_long *__last;
  unsigned_long *in_stack_ffffffffffffff80;
  unsigned_long *puVar9;
  double local_78;
  ulong local_70;
  double local_68;
  long local_48;
  
  if (*(int *)((long)row_1 + in_RCX * 4) == *(int *)((long)row_1 + in_RCX * 4 + 4)) {
    *(undefined8 *)w_this = 0;
    *(undefined8 *)m_prev = 0;
  }
  else {
    local_48 = (long)*(int *)((long)row_1 + in_RCX * 4);
    lVar4 = (long)(*(int *)((long)row_1 + in_RCX * 4 + 4) + -1);
    iVar1 = *(int *)(in_R9 + lVar4 * 4);
    local_a0 = std::lower_bound<unsigned_long*,unsigned_long>
                         (in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                          in_stack_ffffffffffffff70);
    local_68 = 0.0;
    for (local_70 = in_RSI; local_70 <= in_RDX; local_70 = local_70 + 1) {
      pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)s,
                          *(size_type *)(in_RDI + local_70 * 8));
      local_68 = *pvVar5 + local_68;
    }
    local_78 = 0.0;
    puVar9 = (unsigned_long *)0x0;
    __last = (unsigned_long *)0x0;
    __val = (unsigned_long *)0x0;
    while( true ) {
      bVar7 = false;
      if ((local_a0 != (ulong *)(in_RDI + in_RDX * 8 + 8)) && (bVar7 = false, local_48 != lVar4 + 1)
         ) {
        bVar7 = *local_a0 <= (ulong)(long)iVar1;
      }
      if (!bVar7) break;
      if (*(int *)(in_R9 + local_48 * 4) == (int)*local_a0) {
        uVar2 = std::isnan(*(double *)(in_R8 + local_48 * 8));
        local_a2 = 1;
        if ((uVar2 & 1) == 0) {
          iVar3 = std::isinf(*(double *)(in_R8 + local_48 * 8));
          local_a2 = (byte)iVar3;
        }
        if ((local_a2 & 1) == 0) {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)s,*local_a0);
          __x = *pvVar5;
          if ((local_78 == 0.0) && (!NAN(local_78))) {
            __val = *(unsigned_long **)(in_R8 + local_48 * 8);
          }
          local_78 = __x + local_78;
          puVar9 = (unsigned_long *)
                   fma(__x,(*(double *)(in_R8 + local_48 * 8) - (double)puVar9) / local_78,
                       (double)puVar9);
          dVar8 = *(double *)(in_R8 + local_48 * 8) - (double)__val;
          __val = puVar9;
          __last = (unsigned_long *)
                   fma(__x,(*(double *)(in_R8 + local_48 * 8) - (double)puVar9) * dVar8,
                       (double)__last);
          puVar9 = __val;
        }
        else {
          pvVar5 = std::vector<double,_std::allocator<double>_>::operator[]
                             ((vector<double,_std::allocator<double>_> *)s,*local_a0);
          local_68 = local_68 - *pvVar5;
        }
        if ((local_a0 == (ulong *)(in_RDI + in_RDX * 8)) || (local_48 == lVar4)) break;
        local_a0 = local_a0 + 1;
        piVar6 = std::lower_bound<int*,unsigned_long>((int *)puVar9,(int *)__last,__val);
        local_48 = (long)piVar6 - in_R9 >> 2;
      }
      else if ((int)*local_a0 < *(int *)(in_R9 + local_48 * 4)) {
        local_a0 = std::lower_bound<unsigned_long*,int>(puVar9,__last,(int *)__val);
      }
      else {
        piVar6 = std::lower_bound<int*,unsigned_long>((int *)puVar9,(int *)__last,__val);
        local_48 = (long)piVar6 - in_R9 >> 2;
      }
    }
    if ((local_78 != 0.0) || (NAN(local_78))) {
      if (local_78 < local_68) {
        __last = (unsigned_long *)
                 ((double)puVar9 * (double)puVar9 * local_78 * (1.0 - local_78 / local_68) +
                 (double)__last);
        puVar9 = (unsigned_long *)((local_78 / local_68) * (double)puVar9);
      }
      *(unsigned_long **)m_prev = puVar9;
      *(double *)w_this = SQRT((double)__last / local_68);
    }
    else {
      *(undefined8 *)m_prev = 0;
      *(undefined8 *)w_this = 0;
    }
  }
  return;
}

Assistant:

void calc_mean_and_sd_weighted(size_t *restrict ix_arr, size_t st, size_t end, size_t col_num,
                               real_t_ *restrict Xc, sparse_ix *restrict Xc_ind, sparse_ix *restrict Xc_indptr,
                               double &restrict x_sd, double &restrict x_mean, mapping &restrict w)
{
    /* ix_arr must be already sorted beforehand */
    if (Xc_indptr[col_num] == Xc_indptr[col_num + 1])
    {
        x_sd   = 0;
        x_mean = 0;
        return;
    }
    size_t st_col  = Xc_indptr[col_num];
    size_t end_col = Xc_indptr[col_num + 1] - 1;
    size_t curr_pos = st_col;
    size_t ind_end_col = (size_t) Xc_ind[end_col];
    size_t *ptr_st = std::lower_bound(ix_arr + st, ix_arr + end + 1, (size_t)Xc_ind[st_col]);

    ldouble_safe cnt = 0.;
    for (size_t row = st; row <= end; row++)
        cnt += w[ix_arr[row]];
    ldouble_safe added = 0;
    ldouble_safe m = 0;
    ldouble_safe s = 0;
    ldouble_safe m_prev = 0;
    ldouble_safe w_this;

    for (size_t *row = ptr_st;
         row != ix_arr + end + 1 && curr_pos != end_col + 1 && ind_end_col >= *row;
        )
    {
        if (Xc_ind[curr_pos] == (sparse_ix)(*row))
        {
            if (unlikely(is_na_or_inf(Xc[curr_pos])))
            {
                cnt -= w[*row];
            }

            else
            {
                w_this = w[*row];
                if (added == 0) m_prev = Xc[curr_pos];
                added += w_this;
                m = std::fma(w_this, (Xc[curr_pos] - m) / added, m);
                s = std::fma(w_this, (Xc[curr_pos] - m) * (Xc[curr_pos] - m_prev), s);
                m_prev = m;
            }

            if (row == ix_arr + end || curr_pos == end_col) break;
            curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *(++row)) - Xc_ind;
        }

        else
        {
            if (Xc_ind[curr_pos] > (sparse_ix)(*row))
                row = std::lower_bound(row + 1, ix_arr + end + 1, Xc_ind[curr_pos]);
            else
                curr_pos = std::lower_bound(Xc_ind + curr_pos + 1, Xc_ind + end_col + 1, *row) - Xc_ind;
        }
    }

    if (added == 0)
    {
        x_mean = 0;
        x_sd = 0;
        return;
    }

    /* Note: up to this point:
         m = sum(x)/nnz
         s = sum(x^2) - (1/nnz)*(sum(x)^2)
       Here the standard deviation is given by:
         sigma = (1/n)*(sum(x^2) - (1/n)*(sum(x)^2))
       The difference can be put to a closed form. */
    if (cnt > added)
    {
        s += square(m) * (added * ((ldouble_safe)1 - (ldouble_safe)added/(ldouble_safe)cnt));
        m *= added / cnt;
    }

    x_mean = m;
    x_sd   = std::sqrt(s / (ldouble_safe)cnt);
}